

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O1

void DumpCoverageList(range_list list)

{
  while( true ) {
    if (list == (range_list)0x0) {
      return;
    }
    printf("%zd - %zd",list->start,list->end);
    if (list->next == (_range_list *)0x0) break;
    printf(", ");
    list = list->next;
  }
  return;
}

Assistant:

static void DumpCoverageList(range_list list)
{
    if (!list)
        return;
    printf("%zd - %zd", list->start, list->end);
    if (list->next != NULL)
    {
        printf(", ");
        DumpCoverageList(list->next);
    }
}